

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O0

void test_z5_standart_field_operators<Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_cf8;
  basic_cstring<const_char> local_ce8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_cd8;
  int local_cb4;
  assertion_result local_cb0;
  basic_cstring<const_char> local_c98;
  basic_cstring<const_char> local_c88;
  basic_cstring<const_char> local_c78;
  basic_cstring<const_char> local_c68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c58;
  int local_c34;
  assertion_result local_c30;
  basic_cstring<const_char> local_c18;
  basic_cstring<const_char> local_c08;
  basic_cstring<const_char> local_bf8;
  basic_cstring<const_char> local_be8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bd8;
  int local_bb4;
  assertion_result local_bb0;
  basic_cstring<const_char> local_b98;
  basic_cstring<const_char> local_b88;
  basic_cstring<const_char> local_b78;
  basic_cstring<const_char> local_b68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b58;
  int local_b34;
  assertion_result local_b30;
  basic_cstring<const_char> local_b18;
  basic_cstring<const_char> local_b08;
  basic_cstring<const_char> local_af8;
  basic_cstring<const_char> local_ae8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ad8;
  int local_ab4;
  assertion_result local_ab0;
  basic_cstring<const_char> local_a98;
  basic_cstring<const_char> local_a88;
  basic_cstring<const_char> local_a78;
  basic_cstring<const_char> local_a68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a58;
  int local_a34;
  assertion_result local_a30;
  basic_cstring<const_char> local_a18;
  basic_cstring<const_char> local_a08;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9d8;
  int local_9b4;
  assertion_result local_9b0;
  basic_cstring<const_char> local_998;
  basic_cstring<const_char> local_988;
  basic_cstring<const_char> local_978;
  basic_cstring<const_char> local_968;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_958;
  int local_934;
  assertion_result local_930;
  basic_cstring<const_char> local_918;
  basic_cstring<const_char> local_908;
  basic_cstring<const_char> local_8f8;
  basic_cstring<const_char> local_8e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8d8;
  assertion_result local_8b8;
  basic_cstring<const_char> local_8a0;
  basic_cstring<const_char> local_890;
  undefined4 local_87c;
  basic_cstring<const_char> local_878;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_868;
  basic_cstring<const_char> local_840;
  basic_cstring<const_char> local_830;
  undefined4 local_81c;
  basic_cstring<const_char> local_818;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_808;
  basic_cstring<const_char> local_7e0;
  basic_cstring<const_char> local_7d0;
  int local_7bc [2];
  Zp_field_element<5U,_unsigned_int,_void> local_7b4;
  int local_7b0;
  int local_7ac;
  basic_cstring<const_char> local_7a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_798;
  basic_cstring<const_char> local_770;
  basic_cstring<const_char> local_760;
  undefined4 local_750;
  Zp_field_element<5U,_unsigned_int,_void> local_74c;
  int local_748;
  int local_744;
  basic_cstring<const_char> local_740;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_730;
  basic_cstring<const_char> local_708;
  basic_cstring<const_char> local_6f8;
  undefined4 local_6e8;
  int local_6e4;
  Zp_field_element<5U,_unsigned_int,_void> local_6e0;
  persistence_fields local_6dc [4];
  basic_cstring<const_char> local_6d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6c8;
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  undefined4 local_680;
  int local_67c;
  Zp_field_element<5U,_unsigned_int,_void> local_678;
  persistence_fields local_674 [4];
  basic_cstring<const_char> local_670;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_660;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  undefined4 local_614;
  Zp_field_element<5U,_unsigned_int,_void> local_610;
  persistence_fields local_60c [4];
  basic_cstring<const_char> local_608;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5f8;
  basic_cstring<const_char> local_5d0;
  basic_cstring<const_char> local_5c0;
  undefined4 local_5ac;
  basic_cstring<const_char> local_5a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_598;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  undefined4 local_54c;
  basic_cstring<const_char> local_548;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_538;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  int local_4f0 [4];
  basic_cstring<const_char> local_4e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4d0;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  undefined4 local_484;
  int local_480;
  int local_47c;
  basic_cstring<const_char> local_478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_468;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  undefined4 local_420;
  int local_41c;
  Zp_field_element<5U,_unsigned_int,_void> local_418;
  persistence_fields local_414 [4];
  basic_cstring<const_char> local_410;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_400;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  undefined4 local_3b8;
  int local_3b4;
  Zp_field_element<5U,_unsigned_int,_void> local_3b0;
  persistence_fields local_3ac [4];
  basic_cstring<const_char> local_3a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_398;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  undefined4 local_34c;
  Zp_field_element<5U,_unsigned_int,_void> local_348;
  persistence_fields local_344 [4];
  basic_cstring<const_char> local_340;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_330;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  undefined4 local_2e4;
  basic_cstring<const_char> local_2e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2d0;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  undefined4 local_284;
  basic_cstring<const_char> local_280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_270;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  int local_224 [2];
  Zp_field_element<5U,_unsigned_int,_void> local_21c;
  int local_218;
  int local_214;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_200;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  undefined4 local_1b8;
  Zp_field_element<5U,_unsigned_int,_void> local_1b4;
  int local_1b0;
  int local_1ac;
  basic_cstring<const_char> local_1a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_198;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  undefined4 local_150;
  int local_14c;
  Zp_field_element<5U,_unsigned_int,_void> local_148;
  persistence_fields local_144 [4];
  basic_cstring<const_char> local_140;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_130;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  undefined4 local_e8;
  int local_e4;
  Zp_field_element<5U,_unsigned_int,_void> local_e0;
  persistence_fields local_dc [4];
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  undefined4 local_80;
  Zp_field_element<5U,_unsigned_int,_void> local_7c;
  persistence_fields local_78 [16];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  Zp_field_element<5U,_unsigned_int,_void> local_10;
  Zp_field_element<5U,_unsigned_int,_void> local_c;
  Zp_field_element<5U,_unsigned_int,_void> z52;
  Zp_field_element<5U,_unsigned_int,_void> z51;
  
  Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>::Zp_field_element<int,void>
            ((Zp_field_element<5u,unsigned_int,void> *)&local_c,7);
  Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>::Zp_field_element<int,void>
            ((Zp_field_element<5u,unsigned_int,void> *)&local_10,3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0xbb,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_7c,&local_c);
    Gudhi::persistence_fields::operator+(local_78,&local_7c,&local_10);
    local_80 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_58,&local_68,0xbb,1,2,local_78,"z51 + z52",&local_80,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0xbc,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_e0,&local_c);
    local_e4 = 3;
    Gudhi::persistence_fields::operator+(local_dc,&local_e0,&local_e4);
    local_e8 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_c8,&local_d8,0xbc,1,2,local_dc,"z51 + 3",&local_e8,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0xbd,&local_108);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_130,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_148,&local_10);
    local_14c = 3;
    Gudhi::persistence_fields::operator+(local_144,&local_148,&local_14c);
    local_150 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_130,&local_140,0xbd,1,2,local_144,"z52 + 3",&local_150,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_170);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_160,0xbe,&local_170);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_198,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_1b0 = 7;
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_1b4,&local_c);
    local_1ac = Gudhi::persistence_fields::operator+(&local_1b0,&local_1b4);
    local_1b8 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_198,&local_1a8,0xbe,1,2,&local_1ac,"7 + z51",&local_1b8,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1c8,0xbf,&local_1d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_200,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_218 = 7;
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_21c,&local_10);
    local_214 = Gudhi::persistence_fields::operator+(&local_218,&local_21c);
    local_224[1] = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_200,&local_210,0xbf,1,2,&local_214,"7 + z52",local_224 + 1,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_200);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_224[0] = 3;
  Gudhi::persistence_fields::operator+=(&local_c,local_224);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_248);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0xc1,&local_248);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_270,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_284 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_270,&local_280,0xc1,1,2,&local_c,"z51",&local_284,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_270);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::operator+=(&local_c,&local_10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_298,0xc3,&local_2a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2d0,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_2e4 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_2d0,&local_2e0,0xc3,1,2,&local_c,"z51",&local_2e4,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_308);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f8,0xc6,&local_308);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_330,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_348,&local_c);
    Gudhi::persistence_fields::operator-(local_344,&local_348,&local_10);
    local_34c = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_330,&local_340,0xc6,1,2,local_344,"z51 - z52",&local_34c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_330);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_370);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_360,199,&local_370);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_398,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_3b0,&local_c);
    local_3b4 = 3;
    Gudhi::persistence_fields::operator-(local_3ac,&local_3b0,&local_3b4);
    local_3b8 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_398,&local_3a8,199,1,2,local_3ac,"z51 - 3",&local_3b8,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_398);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c8,200,&local_3d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_400,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_418,&local_10);
    local_41c = 3;
    Gudhi::persistence_fields::operator-(local_414,&local_418,&local_41c);
    local_420 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_400,&local_410,200,1,2,local_414,"z52 - 3",&local_420,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_400);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_440);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_430,0xc9,&local_440);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_468,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_480 = 7;
    local_47c = Gudhi::persistence_fields::operator-(&local_480,&local_c);
    local_484 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_468,&local_478,0xc9,1,2,&local_47c,"7 - z51",&local_484,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_468);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_498,0xca,&local_4a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4d0,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_4f0[2] = 7;
    local_4f0[3] = Gudhi::persistence_fields::operator-(local_4f0 + 2,&local_10);
    local_4f0[1] = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_4d0,&local_4e0,0xca,1,2,local_4f0 + 3,"7 - z52",local_4f0 + 1,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_4f0[0] = 3;
  Gudhi::persistence_fields::operator-=(&local_c,local_4f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_500,0xcc,&local_510);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_538,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_548,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_54c = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_538,&local_548,0xcc,1,2,&local_c,"z51",&local_54c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::operator-=(&local_c,&local_10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_570);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_560,0xce,&local_570);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_598,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_5ac = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_598,&local_5a8,0xce,1,2,&local_c,"z51",&local_5ac,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_598);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5c0,0xd1,&local_5d0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5f8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_610,&local_c);
    Gudhi::persistence_fields::operator*(local_60c,&local_610,&local_10);
    local_614 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_5f8,&local_608,0xd1,1,2,local_60c,"z51 * z52",&local_614,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_638);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_628,0xd2,&local_638);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_660,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_678,&local_c);
    local_67c = 3;
    Gudhi::persistence_fields::operator*(local_674,&local_678,&local_67c);
    local_680 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_660,&local_670,0xd2,1,2,local_674,"z51 * 3",&local_680,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_660);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_690,0xd3,&local_6a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6c8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_6e0,&local_10);
    local_6e4 = 3;
    Gudhi::persistence_fields::operator*(local_6dc,&local_6e0,&local_6e4);
    local_6e8 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_6c8,&local_6d8,0xd3,1,2,local_6dc,"z52 * 3",&local_6e8,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_708);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6f8,0xd4,&local_708);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_730,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_740,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_748 = 7;
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_74c,&local_c);
    local_744 = Gudhi::persistence_fields::operator*(&local_748,&local_74c);
    local_750 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_730,&local_740,0xd4,1,2,&local_744,"7 * z51",&local_750,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_730);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_770);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_760,0xd5,&local_770);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_798,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_7b0 = 7;
    Gudhi::persistence_fields::Zp_field_element<5U,_unsigned_int,_void>::Zp_field_element
              (&local_7b4,&local_10);
    local_7ac = Gudhi::persistence_fields::operator*(&local_7b0,&local_7b4);
    local_7bc[1] = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_798,&local_7a8,0xd5,1,2,&local_7ac,"7 * z52",local_7bc + 1,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_798);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_7bc[0] = 3;
  Gudhi::persistence_fields::operator*=(&local_c,local_7bc);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7d0,0xd7,&local_7e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_808,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_818,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_81c = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_808,&local_818,0xd7,1,2,&local_c,"z51",&local_81c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_808);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::operator*=(&local_c,&local_10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_830,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_840);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_830,0xd9,&local_840);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_868,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_878,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_87c = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<5u,unsigned_int,void>,int>
              (&local_868,&local_878,0xd9,1,2,&local_c,"z51",&local_87c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_868);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_890,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_890,0xdc,&local_8a0);
    bVar2 = Gudhi::persistence_fields::operator==(&local_c,&local_10);
    boost::test_tools::assertion_result::assertion_result(&local_8b8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e8,"z51 == z52",10);
    boost::unit_test::operator<<(&local_8d8,plVar3,&local_8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_8b8,&local_8d8,&local_8f8,0xdc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8d8);
    boost::test_tools::assertion_result::~assertion_result(&local_8b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_908,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_918);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_908,0xdd,&local_918);
    local_934 = 3;
    bVar2 = Gudhi::persistence_fields::operator==(&local_c,&local_934);
    boost::test_tools::assertion_result::assertion_result(&local_930,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_968,"z51 == 3",8);
    boost::unit_test::operator<<(&local_958,plVar3,&local_968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_978,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_930,&local_958,&local_978,0xdd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_958);
    boost::test_tools::assertion_result::~assertion_result(&local_930);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_988,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_998);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_988,0xde,&local_998);
    local_9b4 = 3;
    bVar2 = Gudhi::persistence_fields::operator==(&local_9b4,&local_c);
    boost::test_tools::assertion_result::assertion_result(&local_9b0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,"3 == z51",8);
    boost::unit_test::operator<<(&local_9d8,plVar3,&local_9e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_9b0,&local_9d8,&local_9f8,0xde,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9d8);
    boost::test_tools::assertion_result::~assertion_result(&local_9b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a18);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a08,0xdf,&local_a18);
    local_a34 = 3;
    bVar2 = Gudhi::persistence_fields::operator==(&local_10,&local_a34);
    boost::test_tools::assertion_result::assertion_result(&local_a30,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a68,"z52 == 3",8);
    boost::unit_test::operator<<(&local_a58,plVar3,&local_a68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_a30,&local_a58,&local_a78,0xdf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a58);
    boost::test_tools::assertion_result::~assertion_result(&local_a30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a88,0xe0,&local_a98);
    local_ab4 = 3;
    bVar2 = Gudhi::persistence_fields::operator==(&local_ab4,&local_10);
    boost::test_tools::assertion_result::assertion_result(&local_ab0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ae8,"3 == z52",8);
    boost::unit_test::operator<<(&local_ad8,plVar3,&local_ae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_af8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_ab0,&local_ad8,&local_af8,0xe0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ad8);
    boost::test_tools::assertion_result::~assertion_result(&local_ab0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b18);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b08,0xe1,&local_b18);
    local_b34 = 1;
    bVar2 = Gudhi::persistence_fields::operator!=(&local_c,&local_b34);
    boost::test_tools::assertion_result::assertion_result(&local_b30,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b68,"z51 != 1",8);
    boost::unit_test::operator<<(&local_b58,plVar3,&local_b68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_b30,&local_b58,&local_b78,0xe1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b58);
    boost::test_tools::assertion_result::~assertion_result(&local_b30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b88,0xe2,&local_b98);
    local_bb4 = 7;
    bVar2 = Gudhi::persistence_fields::operator!=(&local_bb4,&local_c);
    boost::test_tools::assertion_result::assertion_result(&local_bb0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_be8,"7 != z51",8);
    boost::unit_test::operator<<(&local_bd8,plVar3,&local_be8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_bb0,&local_bd8,&local_bf8,0xe2,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bd8);
    boost::test_tools::assertion_result::~assertion_result(&local_bb0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c18);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c08,0xe3,&local_c18);
    local_c34 = 7;
    bVar2 = Gudhi::persistence_fields::operator!=(&local_10,&local_c34);
    boost::test_tools::assertion_result::assertion_result(&local_c30,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c68,"z52 != 7",8);
    boost::unit_test::operator<<(&local_c58,plVar3,&local_c68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_c30,&local_c58,&local_c78,0xe3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c58);
    boost::test_tools::assertion_result::~assertion_result(&local_c30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c88,0xe4,&local_c98);
    local_cb4 = 1;
    bVar2 = Gudhi::persistence_fields::operator!=(&local_cb4,&local_10);
    boost::test_tools::assertion_result::assertion_result(&local_cb0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ce8,"1 != z52",8);
    boost::unit_test::operator<<(&local_cd8,plVar3,&local_ce8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::test_tools::tt_detail::report_assertion(&local_cb0,&local_cd8,&local_cf8,0xe4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_cd8);
    boost::test_tools::assertion_result::~assertion_result(&local_cb0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void test_z5_standart_field_operators() {
  Z5 z51(7);
  Z5 z52(3);

  //+
  BOOST_CHECK_EQUAL(z51 + z52, 0);
  BOOST_CHECK_EQUAL(z51 + 3, 0);
  BOOST_CHECK_EQUAL(z52 + 3, 1);
  BOOST_CHECK_EQUAL(7 + z51, 4);
  BOOST_CHECK_EQUAL(7 + z52, 0);
  z51 += 3;
  BOOST_CHECK_EQUAL(z51, 0);
  z51 += z52;
  BOOST_CHECK_EQUAL(z51, 3);

  //-
  BOOST_CHECK_EQUAL(z51 - z52, 0);
  BOOST_CHECK_EQUAL(z51 - 3, 0);
  BOOST_CHECK_EQUAL(z52 - 3, 0);
  BOOST_CHECK_EQUAL(7 - z51, 4);
  BOOST_CHECK_EQUAL(7 - z52, 4);
  z51 -= 3;
  BOOST_CHECK_EQUAL(z51, 0);
  z51 -= z52;
  BOOST_CHECK_EQUAL(z51, 2);

  //*
  BOOST_CHECK_EQUAL(z51 * z52, 1);
  BOOST_CHECK_EQUAL(z51 * 3, 1);
  BOOST_CHECK_EQUAL(z52 * 3, 4);
  BOOST_CHECK_EQUAL(7 * z51, 4);
  BOOST_CHECK_EQUAL(7 * z52, 1);
  z51 *= 3;
  BOOST_CHECK_EQUAL(z51, 1);
  z51 *= z52;
  BOOST_CHECK_EQUAL(z51, 3);

  //==
  BOOST_CHECK(z51 == z52);
  BOOST_CHECK(z51 == 3);
  BOOST_CHECK(3 == z51);
  BOOST_CHECK(z52 == 3);
  BOOST_CHECK(3 == z52);
  BOOST_CHECK(z51 != 1);
  BOOST_CHECK(7 != z51);
  BOOST_CHECK(z52 != 7);
  BOOST_CHECK(1 != z52);
}